

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O2

void __thiscall
dg::pta::PSEquivalentNodesMerger::merge(PSEquivalentNodesMerger *this,PSNode *node1,PSNode *node2)

{
  SubgraphNode<dg::pta::PSNode>::replaceAllUsesWith
            (&node1->super_SubgraphNode<dg::pta::PSNode>,node2,true);
  removeNode(*(PointerGraph **)this,node1);
  PointsToMapping<dg::pta::PSNode_*>::add
            ((PointsToMapping<dg::pta::PSNode_*> *)(this + 8),node1,node2);
  *(int *)(this + 0x40) = *(int *)(this + 0x40) + 1;
  return;
}

Assistant:

void PSEquivalentNodesMerger::merge(PSNode *node1, PSNode *node2) {
    // remove node1
    node1->replaceAllUsesWith(node2);
    removeNode(G, node1);

    // update the mapping
    mapping.add(node1, node2);

    ++merged_nodes_num;
}